

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_rename(ASMState *as,Reg down,Reg up)

{
  IRIns *pIVar1;
  byte bVar2;
  uint uVar3;
  IRIns *ir;
  IRRef ref;
  Reg up_local;
  Reg down_local;
  ASMState *as_local;
  
  uVar3 = as->cost[down];
  as->cost[up] = uVar3;
  uVar3 = uVar3 & 0xffff;
  pIVar1 = as->ir;
  bVar2 = (byte)up;
  pIVar1[uVar3].field_1.r = bVar2;
  as->cost[down] = 0;
  as->freeset = 1 << ((byte)down & 0x1f) | as->freeset;
  as->modset = 1 << ((byte)down & 0x1f) | as->modset;
  as->freeset = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & as->freeset;
  as->weakset = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & as->weakset;
  emit_movrr(as,pIVar1 + uVar3,down,up);
  if (*(char *)((long)as->ir + (ulong)uVar3 * 8 + 7) == '\0') {
    ra_addrename(as,down,uVar3,as->snapno + as->snapalloc);
  }
  return;
}

Assistant:

static void ra_rename(ASMState *as, Reg down, Reg up)
{
  IRRef ref = regcost_ref(as->cost[up] = as->cost[down]);
  IRIns *ir = IR(ref);
  ir->r = (uint8_t)up;
  as->cost[down] = 0;
  lj_assertA((down < RID_MAX_GPR) == (up < RID_MAX_GPR),
	     "rename between GPR/FPR %d and %d", down, up);
  lj_assertA(!rset_test(as->freeset, down), "rename from free reg %d", down);
  lj_assertA(rset_test(as->freeset, up), "rename to non-free reg %d", up);
  ra_free(as, down);  /* 'down' is free ... */
  ra_modified(as, down);
  rset_clear(as->freeset, up);  /* ... and 'up' is now allocated. */
  ra_noweak(as, up);
  RA_DBGX((as, "rename    $f $r $r", regcost_ref(as->cost[up]), down, up));
  emit_movrr(as, ir, down, up);  /* Backwards codegen needs inverse move. */
  if (!ra_hasspill(IR(ref)->s)) {  /* Add the rename to the IR. */
    /*
    ** The rename is effective at the subsequent (already emitted) exit
    ** branch. This is for the current snapshot (as->snapno). Except if we
    ** haven't yet allocated any refs for the snapshot (as->snapalloc == 1),
    ** then it belongs to the next snapshot.
    ** See also the discussion at asm_snap_checkrename().
    */
    ra_addrename(as, down, ref, as->snapno + as->snapalloc);
  }
}